

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdir-posix.c
# Opt level: O0

pboolean p_dir_create(pchar *path,pint mode,PError **error)

{
  pboolean pVar1;
  int iVar2;
  PErrorIO code;
  pint native_code;
  PError **error_local;
  pint mode_local;
  pchar *path_local;
  
  if (path == (pchar *)0x0) {
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
    path_local._4_4_ = 0;
  }
  else {
    pVar1 = p_dir_is_exists(path);
    if (pVar1 == 0) {
      iVar2 = mkdir(path,mode);
      if (iVar2 == 0) {
        path_local._4_4_ = 1;
      }
      else {
        code = p_error_get_last_io();
        native_code = p_error_get_last_system();
        p_error_set_error_p(error,code,native_code,"Failed to call mkdir() to create directory");
        path_local._4_4_ = 0;
      }
    }
    else {
      path_local._4_4_ = 1;
    }
  }
  return path_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_dir_create (const pchar	*path,
	      pint		mode,
	      PError		**error)
{
	if (P_UNLIKELY (path == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (p_dir_is_exists (path))
		return TRUE;

	if (P_UNLIKELY (mkdir (path, (mode_t) mode) != 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to call mkdir() to create directory");
		return FALSE;
	} else
		return TRUE;
}